

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::GetPackedMipTailStartLod(GmmResourceInfoCommon *this)

{
  int iVar1;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar2;
  uint32_t local_2c;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t NumTilesForPackedMips;
  uint32_t NumPackedMips;
  GmmResourceInfoCommon *this_local;
  
  pPlatform._4_4_ = 0;
  pPlatform._0_4_ = 0;
  _NumTilesForPackedMips = this;
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar2 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar1));
  (*this->_vptr_GmmResourceInfoCommon[0x11])(this,(long)&pPlatform + 4,&pPlatform);
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])();
  if (iVar1 == 0) {
    local_2c = pGVar2->MaxLod;
  }
  else {
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x2a])();
    local_2c = (iVar1 - pPlatform._4_4_) + 1;
  }
  return local_2c;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetPackedMipTailStartLod()

{
    uint32_t NumPackedMips = 0, NumTilesForPackedMips = 0;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());

    GetTiledResourceMipPacking(&NumPackedMips,
                               &NumTilesForPackedMips);

    return (GetMaxLod() == 0) ?
           pPlatform->MaxLod :
           GetMaxLod() - NumPackedMips + 1; //GetMaxLod srarts at index 0, while NumPackedMips is just
                                            //the number of mips. So + 1 to bring them to same units.
}